

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O0

void Js::InlineCache::OutputPropertyValue<false,_false,_(Js::CacheType)1,_(Js::SlotType)1>::impl
               (InlineCache *cache,Var instance,RecyclableObject *propertyObject,
               PropertyId propertyId,Var *propertyValue,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int slotIndex;
  BOOL BVar3;
  DynamicObject *sourceObject;
  Var pvVar4;
  RecyclableObject *pRVar5;
  JavascriptLibrary *this;
  RecyclableObject *pRVar6;
  ThreadContext *this_00;
  Type *this_01;
  undefined4 *puVar7;
  Var local_48;
  Var rootObjectValue;
  Var slowPathValue;
  ScriptContext *requestContext_local;
  Var *propertyValue_local;
  PropertyId propertyId_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  InlineCache *cache_local;
  
  sourceObject = GetSourceObject<(Js::CacheType)1>(cache,propertyObject);
  slotIndex = GetSlotIndex<(Js::CacheType)1>(cache);
  pvVar4 = GetPropertyValue<(Js::SlotType)1>(sourceObject,slotIndex);
  *propertyValue = pvVar4;
  pRVar5 = (RecyclableObject *)
           Js::JavascriptOperators::GetProperty
                     (propertyObject,propertyId,requestContext,(PropertyValueInfo *)0x0);
  local_48 = (Var)0x0;
  bVar2 = VarIs<Js::RootObjectBase,Js::RecyclableObject>(propertyObject);
  if (bVar2) {
    local_48 = Js::JavascriptOperators::GetRootProperty
                         (propertyObject,propertyId,requestContext,(PropertyValueInfo *)0x0);
  }
  if (((RecyclableObject *)*propertyValue != pRVar5) &&
     ((bVar2 = VarIs<Js::RootObjectBase,Js::RecyclableObject>(propertyObject), !bVar2 ||
      (*propertyValue != local_48)))) {
    this = ScriptContext::GetLibrary(requestContext);
    pRVar6 = JavascriptLibraryBase::GetNull(&this->super_JavascriptLibraryBase);
    if (pRVar5 == pRVar6) {
      this_00 = ScriptContext::GetThreadContext(requestContext);
      bVar2 = ThreadContext::IsDisableImplicitCall(this_00);
      if (bVar2) {
        this_01 = RecyclableObject::GetType(propertyObject);
        BVar3 = Js::Type::IsExternal(this_01);
        if (BVar3 != 0) {
          return;
        }
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x1d7,
                                "(*propertyValue == slowPathValue || (VarIs<RootObjectBase>(propertyObject) && *propertyValue == rootObjectValue) || (slowPathValue == requestContext->GetLibrary()->GetNull() && requestContext->GetThreadContext()->IsDisableImplicitCall() && propertyObject->GetType()->IsExternal()))"
                                ,
                                "*propertyValue == slowPathValue || (VarIs<RootObjectBase>(propertyObject) && *propertyValue == rootObjectValue) || (slowPathValue == requestContext->GetLibrary()->GetNull() && requestContext->GetThreadContext()->IsDisableImplicitCall() && propertyObject->GetType()->IsExternal())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return;
}

Assistant:

static void impl(
                InlineCache* cache,
                Var const instance,
                RecyclableObject *const propertyObject,
                const PropertyId propertyId,
                Var *const propertyValue,
                ScriptContext *const requestContext)
            {
                *propertyValue = InlineCache::GetPropertyValue<slotType>(cache->GetSourceObject<cacheType>(propertyObject), cache->GetSlotIndex<cacheType>());
#if DBG
                Var slowPathValue = JavascriptOperators::GetProperty(propertyObject, propertyId, requestContext);
                Var rootObjectValue = nullptr;
                if (VarIs<RootObjectBase>(propertyObject))
                {
                    rootObjectValue = JavascriptOperators::GetRootProperty(propertyObject, propertyId, requestContext);
                }
                Assert(*propertyValue == slowPathValue ||
                    (VarIs<RootObjectBase>(propertyObject) && *propertyValue == rootObjectValue) ||
                    // In some cases, such as CustomExternalObject, if implicit calls are disabled GetPropertyQuery may return null. See CustomExternalObject::GetPropertyQuery for an example.
                    (slowPathValue == requestContext->GetLibrary()->GetNull() && requestContext->GetThreadContext()->IsDisableImplicitCall() && propertyObject->GetType()->IsExternal()));
#endif
            }